

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall Excel::Exception::Exception(Exception *this,wstring *what)

{
  pointer pwVar1;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,"Use whatAsWString() method.");
  *(undefined ***)this = &PTR__Exception_001366f0;
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  pwVar1 = (what->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->m_what,pwVar1,pwVar1 + what->_M_string_length);
  return;
}

Assistant:

inline
Exception::Exception( const std::wstring & what )
	:	std::runtime_error( "Use whatAsWString() method." )
	,	m_what( what )
{
}